

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

bool shm::key_copy(shm_key_t *dst_key,char *src_key)

{
  char *src_key_local;
  shm_key_t *dst_key_local;
  
  memset(dst_key,0,0x18);
  strncpy(*dst_key,src_key,0x18);
  return true;
}

Assistant:

bool      
shm::key_copy( shm_key_t               &dst_key,
               const   shm_key_t        src_key )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    std::memset( dst_key, '\0', shm_key_length );
    std::strncpy(   (char*) dst_key,
                    src_key,
                    shm_key_length );
    return( true );                    
#elif _USE_SYSTEMV_SHM_ == 1
    dst_key = src_key;
    return( true );
#else
    //not implemented
    return( false );
#endif
}